

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Finish
          (FlatBufferBuilderImpl<false> *this,uoffset_t root,char *file_identifier,bool size_prefix)

{
  uint *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uoffset_t element;
  ulong uVar4;
  size_t sVar5;
  
  if (this->finished == true) {
    __assert_fail("!finished",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x4ec,
                  "void flatbuffers::FlatBufferBuilderImpl<>::Finish(uoffset_t, const char *, bool) [Is64Aware = false]"
                 );
  }
  NotNested(this);
  uVar2 = this->minalign_;
  (this->buf_).scratch_ = (this->buf_).buf_;
  uVar4 = (ulong)size_prefix * 4;
  if (uVar2 < uVar4) {
    this->minalign_ = uVar4;
  }
  PreAlign(this,uVar4 + (ulong)(file_identifier != (char *)0x0) * 4 + 4,this->minalign_);
  if (file_identifier != (char *)0x0) {
    sVar5 = strlen(file_identifier);
    if (sVar5 != 4) {
      __assert_fail("strlen(file_identifier) == kFileIdentifierLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                    ,0x4fc,
                    "void flatbuffers::FlatBufferBuilderImpl<>::Finish(uoffset_t, const char *, bool) [Is64Aware = false]"
                   );
    }
    vector_downward<unsigned_int>::ensure_space(&this->buf_,4);
    puVar3 = (this->buf_).cur_;
    (this->buf_).cur_ = puVar3 + -4;
    puVar1 = &(this->buf_).size_;
    *puVar1 = *puVar1 + 4;
    *(undefined4 *)(puVar3 + -4) = *(undefined4 *)file_identifier;
  }
  element = ReferTo(this,root);
  PushElement<unsigned_int,unsigned_int>(this,element);
  if (size_prefix) {
    PushElement<unsigned_int,unsigned_int>(this,(this->buf_).size_);
  }
  this->finished = true;
  return;
}

Assistant:

void Finish(uoffset_t root, const char *file_identifier, bool size_prefix) {
    // A buffer can only be finished once. To reuse a builder use `clear()`.
    FLATBUFFERS_ASSERT(!finished);

    NotNested();
    buf_.clear_scratch();

    const size_t prefix_size = size_prefix ? sizeof(SizeT) : 0;
    // Make sure we track the alignment of the size prefix.
    TrackMinAlign(prefix_size);

    const size_t root_offset_size = sizeof(uoffset_t);
    const size_t file_id_size = file_identifier ? kFileIdentifierLength : 0;

    // This will cause the whole buffer to be aligned.
    PreAlign(prefix_size + root_offset_size + file_id_size, minalign_);

    if (file_identifier) {
      FLATBUFFERS_ASSERT(strlen(file_identifier) == kFileIdentifierLength);
      PushBytes(reinterpret_cast<const uint8_t *>(file_identifier),
                kFileIdentifierLength);
    }
    PushElement(ReferTo(root));  // Location of root.
    if (size_prefix) { PushElement(GetSize()); }
    finished = true;
  }